

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CThreadSuspensionInfo::InternalSuspendNewThreadFromData
          (CThreadSuspensionInfo *this,CPalThread *pThread)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  ssize_t read_ret;
  int iStack_28;
  BYTE resume_code;
  int pipe_descs [2];
  PAL_ERROR palError;
  CPalThread *pThread_local;
  CThreadSuspensionInfo *this_local;
  
  pipe_descs[0] = 0;
  unique0x10000193 = pThread;
  AcquireSuspensionLock(this,pThread);
  SetSelfSusp(&stack0xffffffffffffffe0->suspensionInfo,1);
  ReleaseSuspensionLock(this,stack0xffffffffffffffe0);
  iVar1 = pipe((int *)((long)&read_ret + 4));
  if (iVar1 == -1) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    piVar2 = __errno_location();
    strerror(*piVar2);
    this_local._4_4_ = 8;
  }
  else {
    SetBlockingPipe(&stack0xffffffffffffffe0->suspensionInfo,iStack_28);
    CPalThread::SetStartStatus(stack0xffffffffffffffe0,true);
    read_ret._3_1_ = '\0';
    do {
      sVar3 = read(read_ret._4_4_,(void *)((long)&read_ret + 3),1);
      if (sVar3 == 1) goto LAB_00171474;
    } while ((sVar3 == -1) && (piVar2 = __errno_location(), *piVar2 == 4));
    pipe_descs[0] = 0x54f;
LAB_00171474:
    if ((pipe_descs[0] == 0) && (read_ret._3_1_ != '*')) {
      pipe_descs[0] = 0x54f;
    }
    if (pipe_descs[0] == 0) {
      AcquireSuspensionLock(this,stack0xffffffffffffffe0);
      SetSelfSusp(&stack0xffffffffffffffe0->suspensionInfo,0);
      ReleaseSuspensionLock(this,stack0xffffffffffffffe0);
    }
    close(read_ret._4_4_);
    close(iStack_28);
    this_local._4_4_ = pipe_descs[0];
  }
  return this_local._4_4_;
}

Assistant:

PAL_ERROR
CThreadSuspensionInfo::InternalSuspendNewThreadFromData(
    CPalThread *pThread
    )
{
    PAL_ERROR palError = NO_ERROR;

    AcquireSuspensionLock(pThread);
    pThread->suspensionInfo.SetSelfSusp(TRUE);
    ReleaseSuspensionLock(pThread);

    int pipe_descs[2];
    if (pipe(pipe_descs) == -1)
    {
        ERROR("pipe() failed! error is %d (%s)\n", errno, strerror(errno));
        return ERROR_NOT_ENOUGH_MEMORY;
    }

    // [0] is the read end of the pipe, and [1] is the write end.
    pThread->suspensionInfo.SetBlockingPipe(pipe_descs[1]);
    pThread->SetStartStatus(TRUE);

    BYTE resume_code = 0;
    ssize_t read_ret;

    // Block until ResumeThread writes something to the pipe
    while ((read_ret = read(pipe_descs[0], &resume_code, sizeof(resume_code))) != sizeof(resume_code))
    {
        if (read_ret != -1 || EINTR != errno)
        {
            // read might return 0 (with EAGAIN) if the other end of the pipe gets closed
            palError = ERROR_INTERNAL_ERROR;
            break;
        }
    }

    if (palError == NO_ERROR && resume_code != WAKEUPCODE)
    {
        // If we did read successfully but the byte didn't match WAKEUPCODE, we treat it as a failure.
        palError = ERROR_INTERNAL_ERROR;
    }

    if (palError == NO_ERROR)
    {
        AcquireSuspensionLock(pThread);
        pThread->suspensionInfo.SetSelfSusp(FALSE);
        ReleaseSuspensionLock(pThread);
    }

    // Close the pipes regardless of whether we were successful.
    close(pipe_descs[0]);
    close(pipe_descs[1]);

    return palError;
}